

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O2

void d68000_movem_er_32(void)

{
  uint uVar1;
  size_t sVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint in_EDI;
  int iVar7;
  int iVar8;
  char buffer [40];
  
  uVar1 = dasm_read_imm_16(in_EDI);
  buffer[0] = '\0';
  uVar6 = 0;
  while (uVar6 < 8) {
    uVar5 = uVar6;
    if ((uVar1 >> (uVar6 & 0x1f) & 1) != 0) {
      iVar7 = 0;
      while ((uVar4 = iVar7 + uVar6, uVar5 = 7, iVar8 = 7 - uVar6, uVar4 != 7 &&
             (uVar5 = uVar4, iVar8 = iVar7, (uVar1 >> ((byte)uVar4 & 0x1f) & 2) != 0))) {
        iVar7 = iVar7 + 1;
      }
      if (buffer[0] != '\0') {
        sVar2 = strlen(buffer);
        (buffer + sVar2)[0] = '/';
        (buffer + sVar2)[1] = '\0';
      }
      sVar2 = strlen(buffer);
      sprintf(buffer + sVar2,"D%d",(ulong)uVar6);
      if (iVar8 != 0) {
        sVar2 = strlen(buffer);
        sprintf(buffer + sVar2,"-D%d",(ulong)(iVar8 + uVar6));
      }
    }
    uVar6 = uVar5 + 1;
  }
  uVar6 = 0;
  while (uVar6 < 8) {
    uVar5 = uVar6;
    if (((uVar1 >> ((byte)uVar6 & 0x1f)) >> 8 & 1) != 0) {
      iVar7 = 0;
      while ((uVar4 = iVar7 + uVar6, uVar5 = 7, iVar8 = 7 - uVar6, uVar4 != 7 &&
             (uVar5 = uVar4, iVar8 = iVar7, ((uVar1 >> ((byte)uVar4 & 0x1f)) >> 9 & 1) != 0))) {
        iVar7 = iVar7 + 1;
      }
      if (buffer[0] != '\0') {
        sVar2 = strlen(buffer);
        (buffer + sVar2)[0] = '/';
        (buffer + sVar2)[1] = '\0';
      }
      sVar2 = strlen(buffer);
      sprintf(buffer + sVar2,"A%d",(ulong)uVar6);
      if (iVar8 != 0) {
        sVar2 = strlen(buffer);
        sprintf(buffer + sVar2,"-A%d",(ulong)(iVar8 + uVar6));
      }
    }
    uVar6 = uVar5 + 1;
  }
  pcVar3 = get_ea_mode_str(g_cpu_ir,2);
  sprintf(g_dasm_str,"movem.l %s, %s",pcVar3,buffer);
  return;
}

Assistant:

static void d68000_movem_er_32(void)
{
	uint data = read_imm_16();
	char buffer[40];
	uint first;
	uint run_length;
	uint i;

	buffer[0] = 0;
	for(i=0;i<8;i++)
	{
		if(data&(1<<i))
		{
			first = i;
			run_length = 0;
			while(i<7 && (data&(1<<(i+1))))
			{
				i++;
				run_length++;
			}
			if(buffer[0] != 0)
				strcat(buffer, "/");
			sprintf(buffer+strlen(buffer), "D%d", first);
			if(run_length > 0)
				sprintf(buffer+strlen(buffer), "-D%d", first + run_length);
		}
	}
	for(i=0;i<8;i++)
	{
		if(data&(1<<(i+8)))
		{
			first = i;
			run_length = 0;
			while(i<7 && (data&(1<<(i+8+1))))
			{
				i++;
				run_length++;
			}
			if(buffer[0] != 0)
				strcat(buffer, "/");
			sprintf(buffer+strlen(buffer), "A%d", first);
			if(run_length > 0)
				sprintf(buffer+strlen(buffer), "-A%d", first + run_length);
		}
	}
	sprintf(g_dasm_str, "movem.l %s, %s", get_ea_mode_str_32(g_cpu_ir), buffer);
}